

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O2

HighsStatus __thiscall Highs::writeHighsInfo(Highs *this,string *filename)

{
  HighsStatus HVar1;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"writeHighsInfo",&local_51);
  std::__cxx11::string::string((string *)&local_50,"writeInfo",&local_52);
  deprecationMessage(this,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  HVar1 = writeInfo(this,filename);
  return HVar1;
}

Assistant:

HighsStatus Highs::writeHighsInfo(const std::string& filename) {
  deprecationMessage("writeHighsInfo", "writeInfo");
  return writeInfo(filename);
}